

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void Imf_3_2::anon_unknown_0::readSampleCountForLineBlock
               (InputStreamMutex *streamData,Data *data,int lineBlockId,
               Array2D<unsigned_int> *sampleCountBuffer,int sampleCountMinY,bool writeToSlice)

{
  int iVar1;
  Compressor *pCVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  ulong uVar8;
  ostream *poVar9;
  ArgExc *pAVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long local_1f8;
  int accumulatedCount;
  char *readPtr;
  long local_1d0;
  long local_1c8;
  char *local_1c0;
  stringstream _iex_throw_s;
  undefined4 uStack_1b4;
  ostream local_1a8 [376];
  
  (*streamData->is->_vptr_IStream[6])
            (streamData->is,
             (data->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[lineBlockId]);
  if ((data->version & 0x1000) != 0) {
    (*streamData->is->_vptr_IStream[3])(streamData->is,&_iex_throw_s,4);
    if (__iex_throw_s != data->partNumber) {
      pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar10,"Unexpected part number.");
      goto LAB_00165522;
    }
  }
  (*streamData->is->_vptr_IStream[3])(streamData->is,&_iex_throw_s,4);
  uVar5 = __iex_throw_s;
  lVar12 = (long)(int)__iex_throw_s;
  if (__iex_throw_s == data->linesInBuffer * lineBlockId + data->minY) {
    iVar13 = __iex_throw_s + data->linesInBuffer + -1;
    if (data->maxY < iVar13) {
      iVar13 = data->maxY;
    }
    (*streamData->is->_vptr_IStream[3])(streamData->is,&_iex_throw_s,8);
    uVar6 = __iex_throw_s;
    uVar8 = CONCAT44(uStack_1b4,__iex_throw_s);
    if (uVar8 <= (ulong)(long)data->maxSampleCountTableSize) {
      (*streamData->is->_vptr_IStream[3])(streamData->is,&_iex_throw_s,8);
      uVar3 = CONCAT44(uStack_1b4,__iex_throw_s);
      (*streamData->is->_vptr_IStream[3])(streamData->is,&_iex_throw_s,8);
      uVar4 = CONCAT44(uStack_1b4,__iex_throw_s);
      if ((uVar3 < 0x80000000) && ((uVar4 | uVar8) >> 0x1f == 0)) {
        (*streamData->is->_vptr_IStream[3])
                  (streamData->is,(data->sampleCountTableBuffer)._data,uVar6);
        if (uVar8 < (ulong)(long)data->maxSampleCountTableSize) {
          pCVar2 = data->sampleCountTableComp;
          if (pCVar2 == (Compressor *)0x0) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
            poVar9 = std::operator<<(local_1a8,"Deep scanline data corrupt at chunk ");
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,lineBlockId);
            std::operator<<(poVar9," (sampleCountTableDataSize error)");
            pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_2::ArgExc::ArgExc(pAVar10,(stringstream *)&_iex_throw_s);
            __cxa_throw(pAVar10,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
          }
          (*pCVar2->_vptr_Compressor[6])
                    (pCVar2,(data->sampleCountTableBuffer)._data,uVar6,(ulong)uVar5,&readPtr);
        }
        else {
          readPtr = (data->sampleCountTableBuffer)._data;
        }
        iVar1 = data->sampleCountXStride;
        local_1d0 = (long)data->sampleCountYStride;
        local_1c8 = (long)iVar13;
        local_1c0 = data->sampleCountSliceBase + lVar12 * local_1d0;
        local_1f8 = lVar12 * 4 + (long)sampleCountMinY * -4;
        lVar15 = 0;
        do {
          if (local_1c8 < lVar12) {
            return;
          }
          lVar17 = lVar12 - data->minY;
          puVar7 = (data->lineSampleCount)._data;
          puVar7[lVar17] = 0;
          lVar16 = (long)data->minX;
          piVar14 = (int *)(local_1c0 + iVar1 * lVar16);
          iVar13 = 0;
          for (; lVar16 <= data->maxX; lVar16 = lVar16 + 1) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>(&readPtr,&accumulatedCount);
            iVar11 = accumulatedCount - iVar13;
            if (accumulatedCount < iVar13) {
              iex_debugTrap();
              std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
              poVar9 = std::operator<<(local_1a8,"Deep scanline sampleCount data corrupt at chunk ")
              ;
              poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,lineBlockId);
              std::operator<<(poVar9," (negative sample count detected)");
              pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_2::ArgExc::ArgExc(pAVar10,(stringstream *)&_iex_throw_s);
              __cxa_throw(pAVar10,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
            }
            if (sampleCountBuffer != (Array2D<unsigned_int> *)0x0) {
              *(int *)((long)sampleCountBuffer->_data +
                      lVar16 * 4 + sampleCountBuffer->_sizeY * local_1f8 + (long)data->minX * -4) =
                   iVar11;
            }
            puVar7 = (data->lineSampleCount)._data;
            puVar7[lVar17] = puVar7[lVar17] + iVar11;
            if (writeToSlice) {
              *piVar14 = iVar11;
            }
            piVar14 = (int *)((long)piVar14 + (long)iVar1);
            iVar13 = accumulatedCount;
          }
          lVar15 = lVar15 + (ulong)puVar7[lVar17];
          uVar8 = data->combinedSampleSize * lVar15;
          if (uVar4 <= uVar8 && uVar8 - uVar4 != 0) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
            poVar9 = std::operator<<(local_1a8,"Deep scanline sampleCount data corrupt at chunk ");
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,lineBlockId);
            poVar9 = std::operator<<(poVar9,": pixel data only contains ");
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            poVar9 = std::operator<<(poVar9," bytes of data but table references at least ");
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            std::operator<<(poVar9," bytes of sample data");
            pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_2::ArgExc::ArgExc(pAVar10,(stringstream *)&_iex_throw_s);
            __cxa_throw(pAVar10,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
          }
          (data->gotSampleCount)._data[lVar12 - data->minY] = true;
          lVar12 = lVar12 + 1;
          local_1c0 = local_1c0 + local_1d0;
          local_1f8 = local_1f8 + 4;
        } while( true );
      }
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      poVar9 = std::operator<<(local_1a8,"This version of the library does not");
      poVar9 = std::operator<<(poVar9,"support the allocation of data with size  > ");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9," file table size    :");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9," file unpacked size :");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9," file packed size   :");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::operator<<(poVar9,".\n");
      pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar10,(stringstream *)&_iex_throw_s);
      __cxa_throw(pAVar10,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar9 = std::operator<<(local_1a8,"Bad sampleCountTableDataSize read from chunk ");
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,lineBlockId);
    poVar9 = std::operator<<(poVar9,": expected ");
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,data->maxSampleCountTableSize);
    poVar9 = std::operator<<(poVar9," or less, got ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar10,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar10,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar10,"Unexpected data block y coordinate.");
LAB_00165522:
  __cxa_throw(pAVar10,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
readSampleCountForLineBlock (
    InputStreamMutex*            streamData,
    DeepScanLineInputFile::Data* data,
    int                          lineBlockId,
    Array2D<unsigned int>*       sampleCountBuffer,
    int                          sampleCountMinY,
    bool                         writeToSlice)
{
    streamData->is->seekg (data->lineOffsets[lineBlockId]);

    if (isMultiPart (data->version))
    {
        int partNumber;
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
            *streamData->is, partNumber);

        if (partNumber != data->partNumber)
            throw IEX_NAMESPACE::ArgExc ("Unexpected part number.");
    }

    int minY;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, minY);

    //
    // Check the correctness of minY.
    //

    if (minY != data->minY + lineBlockId * data->linesInBuffer)
        throw IEX_NAMESPACE::ArgExc ("Unexpected data block y coordinate.");

    int maxY;
    maxY = min (minY + data->linesInBuffer - 1, data->maxY);

    uint64_t sampleCountTableDataSize;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *streamData->is, sampleCountTableDataSize);

    if (sampleCountTableDataSize >
        static_cast<uint64_t> (data->maxSampleCountTableSize))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Bad sampleCountTableDataSize read from chunk "
                << lineBlockId << ": expected " << data->maxSampleCountTableSize
                << " or less, got " << sampleCountTableDataSize);
    }

    uint64_t packedDataSize;
    uint64_t unpackedDataSize;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *streamData->is, packedDataSize);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *streamData->is, unpackedDataSize);

    //
    // We make a check on the data size requirements here.
    // Whilst we wish to store 64bit sizes on disk, not all the compressors
    // have been made to work with such data sizes and are still limited to
    // using signed 32 bit (int) for the data size. As such, this version
    // insists that we validate that the data size does not exceed the data
    // type max limit.
    // @TODO refactor the compressor code to ensure full 64-bit support.
    //

    uint64_t compressorMaxDataSize =
        static_cast<uint64_t> (std::numeric_limits<int>::max ());
    if (packedDataSize > compressorMaxDataSize ||
        unpackedDataSize > compressorMaxDataSize ||
        sampleCountTableDataSize > compressorMaxDataSize)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "This version of the library does not"
                << "support the allocation of data with size  > "
                << compressorMaxDataSize
                << " file table size    :" << sampleCountTableDataSize
                << " file unpacked size :" << unpackedDataSize
                << " file packed size   :" << packedDataSize << ".\n");
    }

    streamData->is->read (
        data->sampleCountTableBuffer,
        static_cast<int> (sampleCountTableDataSize));

    const char* readPtr;

    //
    // If the sample count table is compressed, we'll uncompress it.
    //

    if (sampleCountTableDataSize <
        static_cast<uint64_t> (data->maxSampleCountTableSize))
    {
        if (!data->sampleCountTableComp)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Deep scanline data corrupt at chunk "
                    << lineBlockId << " (sampleCountTableDataSize error)");
        }
        data->sampleCountTableComp->uncompress (
            data->sampleCountTableBuffer,
            static_cast<int> (sampleCountTableDataSize),
            minY,
            readPtr);
    }
    else
        readPtr = data->sampleCountTableBuffer;

    char* base    = data->sampleCountSliceBase;
    int   xStride = data->sampleCountXStride;
    int   yStride = data->sampleCountYStride;

    // total number of samples in block: used to check samplecount table doesn't
    // reference more data than exists

    size_t cumulative_total_samples = 0;

    for (int y = minY; y <= maxY; y++)
    {
        int yInDataWindow                    = y - data->minY;
        data->lineSampleCount[yInDataWindow] = 0;

        int lastAccumulatedCount = 0;
        for (int x = data->minX; x <= data->maxX; x++)
        {
            int accumulatedCount, count;

            //
            // Read the sample count for pixel (x, y).
            //

            Xdr::read<CharPtrIO> (readPtr, accumulatedCount);

            // sample count table should always contain monotonically
            // increasing values.
            if (accumulatedCount < lastAccumulatedCount)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Deep scanline sampleCount data corrupt at chunk "
                        << lineBlockId << " (negative sample count detected)");
            }

            count                = accumulatedCount - lastAccumulatedCount;
            lastAccumulatedCount = accumulatedCount;

            //
            // Store the data in internal data structure.
            //

            if (sampleCountBuffer)
            {
                (*sampleCountBuffer)[y - sampleCountMinY][x - data->minX] =
                    count;
            }
            data->lineSampleCount[yInDataWindow] += count;

            //
            // Store the data in external slice
            //
            if (writeToSlice)
            {
                sampleCount (base, xStride, yStride, x, y) = count;
            }
        }
        cumulative_total_samples += data->lineSampleCount[yInDataWindow];
        if (cumulative_total_samples * data->combinedSampleSize >
            unpackedDataSize)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Deep scanline sampleCount data corrupt at chunk "
                    << lineBlockId << ": pixel data only contains "
                    << unpackedDataSize
                    << " bytes of data but table references at least "
                    << cumulative_total_samples * data->combinedSampleSize
                    << " bytes of sample data");
        }

        data->gotSampleCount[y - data->minY] = true;
    }
}